

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_server.c
# Opt level: O0

int create_ssdp_sock_v6(SOCKET *ssdpSock)

{
  sockaddr *psVar1;
  uint16_t uVar2;
  int iVar3;
  int *piVar4;
  undefined8 in_stack_fffffffffffffdd8;
  undefined4 uVar5;
  undefined8 in_stack_fffffffffffffde8;
  undefined4 uVar6;
  uint32_t *p;
  int ret;
  int onOff;
  sockaddr_in6 *ssdpAddr6;
  sockaddr_storage __ss;
  undefined4 local_148;
  ipv6_mreq ssdpMcastAddr;
  char errorBuffer [256];
  SOCKET *ssdpSock_local;
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  _ret = (sockaddr *)&ssdpAddr6;
  p._0_4_ = 0;
  iVar3 = socket(10,2,0);
  *ssdpSock = iVar3;
  if (*ssdpSock == -1) {
    piVar4 = __errno_location();
    __xpg_strerror_r(*piVar4,(undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc),
                     0x100);
    UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x462,"Error in socket(): %s\n",
               (undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc));
    ssdpSock_local._4_4_ = -0xcd;
  }
  else {
    p._4_4_ = 1;
    p._0_4_ = setsockopt(*ssdpSock,1,2,(void *)((long)&p + 4),4);
    if ((int)p == -1) {
      piVar4 = __errno_location();
      __xpg_strerror_r(*piVar4,(undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc),
                       0x100);
      UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x473,
                 "Error in setsockopt() SO_REUSEADDR: %s\n",
                 (undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc));
      p._0_4_ = -0xd0;
    }
    else {
      p._4_4_ = 1;
      p._0_4_ = setsockopt(*ssdpSock,0x29,0x1a,(void *)((long)&p + 4),4);
      if ((int)p == -1) {
        piVar4 = __errno_location();
        __xpg_strerror_r(*piVar4,(undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc)
                         ,0x100);
        UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x497,
                   "Error in setsockopt() IPV6_V6ONLY: %s\n",
                   (undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc));
        p._0_4_ = -0xd0;
      }
      else {
        memset(&ssdpAddr6,0,0x80);
        _ret->sa_family = 10;
        psVar1 = _ret;
        *(undefined8 *)(_ret->sa_data + 6) = _in6addr_any;
        *(sockaddr_in6 **)(psVar1 + 1) = _ixmlDocument_free;
        *(uint *)(_ret[1].sa_data + 6) = gIF_INDEX;
        uVar2 = htons(0x76c);
        *(uint16_t *)_ret->sa_data = uVar2;
        p._0_4_ = bind(*ssdpSock,_ret,0x1c);
        if ((int)p == -1) {
          piVar4 = __errno_location();
          __xpg_strerror_r(*piVar4,(undefined1 *)
                                   ((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc),0x100);
          UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x4ab,
                     "Error in bind(), addr=%s, index=%d, port=%d: %s\n",gIF_IPV6,
                     CONCAT44(uVar5,gIF_INDEX),0x76c,
                     (undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc));
          p._0_4_ = -0xcb;
        }
        else {
          memset((void *)((long)&__ss.__ss_align + 4),0,0x14);
          ssdpMcastAddr.ipv6mr_multiaddr.__in6_u.__u6_addr32[2] = gIF_INDEX;
          inet_pton(10,"FF02::C",(void *)((long)&__ss.__ss_align + 4));
          p._0_4_ = setsockopt(*ssdpSock,0x29,0x14,(void *)((long)&__ss.__ss_align + 4),0x14);
          if ((int)p == -1) {
            piVar4 = __errno_location();
            __xpg_strerror_r(*piVar4,(undefined1 *)
                                     ((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc),0x100);
            UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x4d1,
                       "Error in setsockopt() IPV6_JOIN_GROUP (join multicast group): %s.\nSSDP_IPV6_LINKLOCAL = %s,\nipv6mr_interface = %u,\nipv6mr_multiaddr[0,1,2,3] = 0x%08X:0x%08X:0x%08X:0x%08X\ngIF_NAME = %s\n"
                       ,(undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc),
                       "FF02::C",ssdpMcastAddr.ipv6mr_multiaddr.__in6_u.__u6_addr32[2],
                       CONCAT44(uVar6,__ss.__ss_align._4_4_),local_148,
                       ssdpMcastAddr.ipv6mr_multiaddr.__in6_u.__u6_addr32[0],
                       ssdpMcastAddr.ipv6mr_multiaddr.__in6_u.__u6_addr32[1],gIF_NAME);
            p._0_4_ = -0xd0;
          }
          else {
            p._4_4_ = 1;
            p._0_4_ = setsockopt(*ssdpSock,1,6,(void *)((long)&p + 4),4);
            if ((int)p == -1) {
              piVar4 = __errno_location();
              __xpg_strerror_r(*piVar4,(undefined1 *)
                                       ((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc),0x100);
              UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x4ef,
                         "Error in setsockopt() SO_BROADCAST (set broadcast): %s\n",
                         (undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc));
              p._0_4_ = -200;
            }
            else {
              p._0_4_ = 0;
            }
          }
        }
      }
    }
    if ((int)p != 0) {
      close(*ssdpSock);
    }
    ssdpSock_local._4_4_ = (int)p;
  }
  return ssdpSock_local._4_4_;
}

Assistant:

static int create_ssdp_sock_v6(
	/* [] SSDP IPv6 socket to be created. */
	SOCKET *ssdpSock)
{
	char errorBuffer[ERROR_BUFFER_LEN];
	struct ipv6_mreq ssdpMcastAddr;
	struct sockaddr_storage __ss;
	struct sockaddr_in6 *ssdpAddr6 = (struct sockaddr_in6 *)&__ss;
	int onOff;
	int ret = 0;

	*ssdpSock = socket(AF_INET6, SOCK_DGRAM, 0);
	if (*ssdpSock == INVALID_SOCKET) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in socket(): %s\n",
			errorBuffer);

		return UPNP_E_OUTOF_SOCKET;
	}
	onOff = 1;
	ret = setsockopt(*ssdpSock,
		SOL_SOCKET,
		SO_REUSEADDR,
		(char *)&onOff,
		sizeof(onOff));
	if (ret == -1) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in setsockopt() SO_REUSEADDR: %s\n",
			errorBuffer);
		ret = UPNP_E_SOCKET_ERROR;
		goto error_handler;
	}
		#if (defined(BSD) && !defined(__GNU__)) || defined(__APPLE__)
	onOff = 1;
	ret = setsockopt(*ssdpSock,
		SOL_SOCKET,
		SO_REUSEPORT,
		(char *)&onOff,
		sizeof(onOff));
	if (ret == -1) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in setsockopt() SO_REUSEPORT: %s\n",
			errorBuffer);
		ret = UPNP_E_SOCKET_ERROR;
		goto error_handler;
	}
		#endif /* BSD, __APPLE__ */
	onOff = 1;
	ret = setsockopt(*ssdpSock,
		IPPROTO_IPV6,
		IPV6_V6ONLY,
		(char *)&onOff,
		sizeof(onOff));
	if (ret == -1) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in setsockopt() IPV6_V6ONLY: %s\n",
			errorBuffer);
		ret = UPNP_E_SOCKET_ERROR;
		goto error_handler;
	}
	memset(&__ss, 0, sizeof(__ss));
	ssdpAddr6->sin6_family = (sa_family_t)AF_INET6;
	ssdpAddr6->sin6_addr = in6addr_any;
		#ifndef _WIN32
	ssdpAddr6->sin6_scope_id = gIF_INDEX;
		#endif
	ssdpAddr6->sin6_port = htons(SSDP_PORT);
	ret = bind(*ssdpSock, (struct sockaddr *)ssdpAddr6, sizeof(*ssdpAddr6));
	if (ret == -1) {
		#ifndef _WIN32
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in bind(), addr=%s, index=%d, port=%d: %s\n",
			gIF_IPV6,
			gIF_INDEX,
			SSDP_PORT,
			errorBuffer);
		ret = UPNP_E_SOCKET_BIND;
		goto error_handler;
		#else
		int wsa_err = WSAGetLastError();
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in bind(), addr=%s, index=%d, port=%d: %d\n",
			gIF_IPV6,
			gIF_INDEX,
			SSDP_PORT,
			wsa_err);
		ret = UPNP_E_SOCKET_BIND;
		goto error_handler;
		#endif
	}
	memset((void *)&ssdpMcastAddr, 0, sizeof(ssdpMcastAddr));
	ssdpMcastAddr.ipv6mr_interface = gIF_INDEX;
	inet_pton(
		AF_INET6, SSDP_IPV6_LINKLOCAL, &ssdpMcastAddr.ipv6mr_multiaddr);
	ret = setsockopt(*ssdpSock,
		IPPROTO_IPV6,
		IPV6_JOIN_GROUP,
		(char *)&ssdpMcastAddr,
		sizeof(ssdpMcastAddr));
	if (ret == -1) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		uint32_t *p = (uint32_t *)&ssdpMcastAddr.ipv6mr_multiaddr;
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in setsockopt() IPV6_JOIN_GROUP (join multicast "
			"group): %s.\n"
			"SSDP_IPV6_LINKLOCAL = %s,\n"
			"ipv6mr_interface = %u,\n"
			"ipv6mr_multiaddr[0,1,2,3] = "
			"0x%08X:0x%08X:0x%08X:0x%08X\n"
			"gIF_NAME = %s\n",
			errorBuffer,
			SSDP_IPV6_LINKLOCAL,
			ssdpMcastAddr.ipv6mr_interface,
			p[0],
			p[1],
			p[2],
			p[3],
			gIF_NAME);
		ret = UPNP_E_SOCKET_ERROR;
		goto error_handler;
	}
	onOff = 1;
	ret = setsockopt(*ssdpSock,
		SOL_SOCKET,
		SO_BROADCAST,
		(char *)&onOff,
		sizeof(onOff));
	if (ret == -1) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in setsockopt() SO_BROADCAST (set broadcast): "
			"%s\n",
			errorBuffer);
		ret = UPNP_E_NETWORK_ERROR;
		goto error_handler;
	}
	ret = UPNP_E_SUCCESS;

error_handler:
	if (ret != UPNP_E_SUCCESS) {
		UpnpCloseSocket(*ssdpSock);
	}

	return ret;
}